

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

long jas_stream_seek(jas_stream_t *stream,long offset,int origin)

{
  int iVar1;
  long newpos;
  long lStack_20;
  int origin_local;
  long offset_local;
  jas_stream_t *stream_local;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("jas_stream_seek(%p, %ld, %d)\n",stream,offset,(ulong)(uint)origin);
  }
  if (((stream->bufmode_ & 0x10U) != 0) && ((stream->bufmode_ & 0x20U) != 0)) {
    __assert_fail("!((stream->bufmode_ & JAS_STREAM_RDBUF) && (stream->bufmode_ & JAS_STREAM_WRBUF))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x33d,"long jas_stream_seek(jas_stream_t *, long, int)");
  }
  stream->flags_ = stream->flags_ & 0xfffffffe;
  lStack_20 = offset;
  if ((stream->bufmode_ & 0x10U) == 0) {
    if (((stream->bufmode_ & 0x20U) != 0) && (iVar1 = jas_stream_flush(stream), iVar1 != 0)) {
      return -1;
    }
  }
  else if (origin == 1) {
    lStack_20 = offset - stream->cnt_;
  }
  stream->cnt_ = 0;
  stream->ptr_ = stream->bufstart_;
  stream->bufmode_ = stream->bufmode_ & 0xffffffcf;
  stream_local = (jas_stream_t *)(*stream->ops_->seek_)(stream->obj_,lStack_20,origin);
  if ((long)stream_local < 0) {
    stream_local = (jas_stream_t *)0xffffffffffffffff;
  }
  return (long)stream_local;
}

Assistant:

long jas_stream_seek(jas_stream_t *stream, long offset, int origin)
{
	long newpos;

	JAS_DBGLOG(100, ("jas_stream_seek(%p, %ld, %d)\n", stream, offset,
	  origin));

	/* The buffer cannot be in use for both reading and writing. */
	assert(!((stream->bufmode_ & JAS_STREAM_RDBUF) && (stream->bufmode_ &
	  JAS_STREAM_WRBUF)));

	/* Reset the EOF indicator (since we may not be at the EOF anymore). */
	stream->flags_ &= ~JAS_STREAM_EOF;

	if (stream->bufmode_ & JAS_STREAM_RDBUF) {
		if (origin == SEEK_CUR) {
			offset -= stream->cnt_;
		}
	} else if (stream->bufmode_ & JAS_STREAM_WRBUF) {
		if (jas_stream_flush(stream)) {
			return -1;
		}
	}
	stream->cnt_ = 0;
	stream->ptr_ = stream->bufstart_;
	stream->bufmode_ &= ~(JAS_STREAM_RDBUF | JAS_STREAM_WRBUF);

	if ((newpos = (*stream->ops_->seek_)(stream->obj_, offset, origin))
	  < 0) {
		return -1;
	}

	return newpos;
}